

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertHelper *this_00;
  value_type file;
  char *expected_predicate_value;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  undefined8 in_stack_fffffffffffff8e8;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  int iVar5;
  hasher *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  undefined2 in_stack_fffffffffffff90c;
  undefined1 in_stack_fffffffffffff90e;
  undefined1 in_stack_fffffffffffff90f;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff910;
  Hasher *this_01;
  Hasher *this_02;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *this_03;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff960;
  AssertionResult local_668 [3];
  value_type local_630;
  int local_624;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_5f8;
  int local_5ec;
  string local_5e8 [55];
  undefined1 local_5b1;
  AssertionResult local_5b0 [3];
  value_type local_578;
  string local_570 [55];
  byte local_539;
  AssertionResult local_538;
  string local_528 [55];
  undefined1 local_4f1;
  AssertionResult local_4f0 [3];
  AssertHelper *local_4b8;
  string local_4b0 [55];
  byte local_479;
  AssertionResult local_478;
  string local_468 [55];
  undefined1 local_431;
  AssertionResult local_430 [9];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_398;
  Hasher local_384;
  string local_378 [55];
  undefined1 local_341;
  AssertionResult local_340;
  string local_330 [55];
  byte local_2f9;
  AssertionResult local_2f8;
  string local_2e8 [55];
  undefined1 local_2b1;
  AssertionResult local_2b0;
  key_type local_2a0;
  string local_298 [55];
  byte local_261;
  AssertionResult local_260;
  string local_250 [55];
  undefined1 local_219;
  AssertionResult local_218;
  string local_208 [55];
  byte local_1d1;
  AssertionResult local_1d0;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_178;
  Hasher local_168;
  Hasher local_15c [13];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_b8;
  Hasher local_a8;
  Hasher local_9c [13];
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  this_01 = local_9c;
  Hasher::Hasher(this_01,0);
  this_02 = &local_a8;
  Hasher::Hasher(this_02,0);
  expected_predicate_value = (char *)0x0;
  this_03 = &local_b8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(this_03,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff910,
             CONCAT17(in_stack_fffffffffffff90f,
                      CONCAT16(in_stack_fffffffffffff90e,
                               CONCAT24(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))),
             in_stack_fffffffffffff900,
             (key_equal *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (allocator_type *)in_stack_fffffffffffff8f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b8);
  Hasher::Hasher(local_15c,0);
  Hasher::Hasher(&local_168,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_178,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff910,
             CONCAT17(in_stack_fffffffffffff90f,
                      CONCAT16(in_stack_fffffffffffff90e,
                               CONCAT24(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))),
             in_stack_fffffffffffff900,
             (key_equal *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (allocator_type *)in_stack_fffffffffffff8f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_178);
  local_189 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf02d86)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_1c0);
    testing::Message::~Message((Message *)0xf02eca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf02f5e);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_1d1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf02f9c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_208);
    testing::Message::~Message((Message *)0xf03071);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf03105);
  local_219 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03146)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_250);
    testing::Message::~Message((Message *)0xf0321b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf032af);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_261 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf032f2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_298);
    testing::Message::~Message((Message *)0xf033c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0345e);
  local_2a0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8f0,iVar5);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                    (key_type *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_2b1 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf034d9)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_2e8);
    testing::Message::~Message((Message *)0xf035ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf03642);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_2f9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03685)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_330);
    testing::Message::~Message((Message *)0xf0375a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf037ee);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
           CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_341 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03843)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_378);
    testing::Message::~Message((Message *)0xf03918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf039af);
  Hasher::Hasher(&local_384,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_398,2,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff910,
             CONCAT17(in_stack_fffffffffffff90f,
                      CONCAT16(in_stack_fffffffffffff90e,
                               CONCAT24(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))),
             in_stack_fffffffffffff900,
             (key_equal *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (allocator_type *)in_stack_fffffffffffff8f0);
  local_431 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03a43)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_468);
    testing::Message::~Message((Message *)0xf03b4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf03bde);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_479 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03c21)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_478);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff910,
               CONCAT13(in_stack_fffffffffffff90f,
                        CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_4b0);
    testing::Message::~Message((Message *)0xf03cf6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf03d8d);
  this_00 = (AssertHelper *)
            HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8dc);
  local_4b8 = this_00;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff960,(value_type *)this_03);
  uVar2 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_4f1 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03e10)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffff90e,in_stack_fffffffffffff90c))
               ,(char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_528);
    testing::Message::~Message((Message *)0xf03ee5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf03f79);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  local_539 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf03fbc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_538);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff90c)),
               (char *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_570);
    testing::Message::~Message((Message *)0xf04091);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf04128);
  file = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                        in_stack_fffffffffffff8dc);
  local_578 = file;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff960,(value_type *)this_03);
  local_5b1 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  iVar5 = CONCAT13(local_5b1,(int3)in_stack_fffffffffffff8fc);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf041ab)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff90c)),file,iVar5,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string(local_5e8);
    testing::Message::~Message((Message *)0xf04280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf04314);
  for (local_5ec = 3; local_5ec < 0x7d1; local_5ec = local_5ec + 1) {
    in_stack_fffffffffffff8f0 =
         (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8dc);
    local_5f8 = in_stack_fffffffffffff8f0;
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff960,(value_type *)this_03);
  }
  for (local_624 = 2000; 2 < local_624; local_624 = local_624 + -1) {
    local_630 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                               in_stack_fffffffffffff8dc);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff960,(value_type *)this_03);
  }
  uVar4 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(uVar4,in_stack_fffffffffffff8e0),
             (bool *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),(type *)0xf04446)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff90c)),file,iVar5,
               (char *)in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff960,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff8e0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff960);
    testing::Message::~Message((Message *)0xf04509);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0459d);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xf045aa);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_398);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xf045c4);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xf045d1);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}